

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O1

Vec_Ptr_t *
Aig_ManPartSplit(Aig_Man_t *p,Vec_Int_t *vNode2Part,Vec_Ptr_t **pvPio2Id,Vec_Ptr_t **pvPart2Pos)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Vec_t *pVVar9;
  Aig_Man_t *pAVar10;
  void **ppvVar11;
  undefined8 *puVar12;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  Vec_Int_t *vPio2IdOne;
  Vec_Int_t *local_38;
  
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar8->pArray = ppvVar7;
  uVar5 = vNode2Part->nSize;
  if ((ulong)uVar5 == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = *vNode2Part->pArray;
    if (1 < (int)uVar5) {
      uVar15 = 1;
      do {
        uVar1 = vNode2Part->pArray[uVar15];
        if ((int)uVar16 <= (int)uVar1) {
          uVar16 = uVar1;
        }
        uVar15 = uVar15 + 1;
      } while (uVar5 != uVar15);
    }
  }
  if ((int)uVar16 < 0) {
    __assert_fail("nParts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPartSat.c"
                  ,0xed,
                  "Vec_Ptr_t *Aig_ManPartSplit(Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t **, Vec_Ptr_t **)"
                 );
  }
  pVVar9 = (Vec_Vec_t *)malloc(0x10);
  uVar15 = 8;
  if (6 < uVar16) {
    uVar15 = (ulong)(uVar16 + 1);
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = (int)uVar15;
  ppvVar7 = (void **)malloc(uVar15 << 3);
  pVVar9->pArray = ppvVar7;
  if (0 < vNode2Part->nSize) {
    lVar17 = 0;
    do {
      if (p->vObjs->nSize <= lVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = p->vObjs->pArray[lVar17];
      if (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7) {
        Vec_VecPush(pVVar9,vNode2Part->pArray[lVar17],pvVar3);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < vNode2Part->nSize);
  }
  pVVar13 = p->vCos;
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      uVar15 = *(ulong *)((long)pVVar13->pArray[lVar17] + 8);
      uVar14 = uVar15 & 0xfffffffffffffffe;
      uVar19 = *(ulong *)(uVar14 + 0x18);
      if (((uint)uVar19 & 7) == 2) {
        *(ulong *)(uVar14 + 0x18) = uVar19 | (ulong)((uVar15 & 1) == 0) * 0x10 + 0x10;
      }
      lVar17 = lVar17 + 1;
      pVVar13 = p->vCos;
    } while (lVar17 < pVVar13->nSize);
  }
  iVar2 = pVVar9->nSize;
  uVar15 = (ulong)iVar2;
  if (0 < (long)uVar15) {
    ppvVar7 = pVVar9->pArray;
    uVar19 = 0;
    do {
      if (((Vec_Ptr_t *)ppvVar7[uVar19])->nSize == 0) {
        printf("Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n",
               uVar19 & 0xffffffff);
      }
      else {
        pAVar10 = Aig_ManPartSplitOne(p,(Vec_Ptr_t *)ppvVar7[uVar19],&local_38);
        pVVar4 = local_38;
        uVar5 = pVVar8->nCap;
        if (pVVar8->nSize == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar8->pArray,0x80);
            }
            iVar18 = 0x10;
          }
          else {
            iVar18 = uVar5 * 2;
            if (iVar18 <= (int)uVar5) goto LAB_00692251;
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar8->pArray,(ulong)uVar5 << 4);
            }
          }
          pVVar8->pArray = ppvVar11;
          pVVar8->nCap = iVar18;
        }
LAB_00692251:
        iVar18 = pVVar8->nSize;
        pVVar8->nSize = iVar18 + 1;
        pVVar8->pArray[iVar18] = pVVar4;
        uVar5 = pVVar6->nSize;
        uVar16 = pVVar6->nCap;
        if (uVar5 == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar6->pArray,0x80);
            }
            iVar18 = 0x10;
          }
          else {
            iVar18 = uVar16 * 2;
            if (iVar18 <= (int)uVar16) goto LAB_006922d5;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar16 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar6->pArray,(ulong)uVar16 << 4);
            }
          }
          pVVar6->pArray = ppvVar11;
          pVVar6->nCap = iVar18;
        }
LAB_006922d5:
        pVVar6->nSize = uVar5 + 1;
        pVVar6->pArray[(int)uVar5] = pAVar10;
      }
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
  }
  if (0 < iVar2) {
    ppvVar7 = pVVar9->pArray;
    uVar19 = 0;
    do {
      pvVar3 = ppvVar7[uVar19];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
  }
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (void **)0x0;
  }
  free(pVVar9);
  uVar5 = pVVar6->nSize;
  pVVar9 = (Vec_Vec_t *)malloc(0x10);
  uVar16 = 8;
  if (6 < uVar5 - 1) {
    uVar16 = uVar5;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = uVar16;
  if (uVar16 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)(int)uVar16 << 3);
  }
  pVVar9->pArray = ppvVar7;
  if (0 < (int)uVar5) {
    uVar15 = 0;
    do {
      puVar12 = (undefined8 *)malloc(0x10);
      *puVar12 = 0;
      puVar12[1] = 0;
      ppvVar7[uVar15] = puVar12;
      uVar15 = uVar15 + 1;
    } while (uVar5 != uVar15);
  }
  pVVar9->nSize = uVar5;
  pVVar13 = p->vCos;
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      uVar15 = *(ulong *)((long)pVVar13->pArray[lVar17] + 8);
      uVar19 = uVar15 & 0xfffffffffffffffe;
      if (((uint)*(ulong *)(uVar19 + 0x18) & 7) == 2) {
        *(ulong *)(uVar19 + 0x18) = *(ulong *)(uVar19 + 0x18) & 0xffffffffffffffca;
      }
      else {
        if (uVar15 == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = *(uint *)(uVar19 + 0x24);
        }
        if (((int)uVar5 < 0) || (vNode2Part->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_VecPush(pVVar9,vNode2Part->pArray[uVar5],pVVar13->pArray[lVar17]);
      }
      lVar17 = lVar17 + 1;
      pVVar13 = p->vCos;
    } while (lVar17 < pVVar13->nSize);
  }
  *pvPio2Id = pVVar8;
  *pvPart2Pos = (Vec_Ptr_t *)pVVar9;
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Aig_ManPartSplit( Aig_Man_t * p, Vec_Int_t * vNode2Part, Vec_Ptr_t ** pvPio2Id, Vec_Ptr_t ** pvPart2Pos )
{
    Vec_Vec_t * vGroups, * vPart2Pos;
    Vec_Ptr_t * vAigs, * vPio2Id, * vNodes;
    Vec_Int_t * vPio2IdOne;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObj, * pDriver;
    int i, nodePart, nParts;
    vAigs = Vec_PtrAlloc( 100 );
    vPio2Id = Vec_PtrAlloc( 100 );
    // put all nodes into levels according to their partition
    nParts = Vec_IntFindMax(vNode2Part) + 1;
    assert( nParts > 0 );
    vGroups = Vec_VecAlloc( nParts );
    Vec_IntForEachEntry( vNode2Part, nodePart, i )
    {
        pObj = Aig_ManObj( p, i );
        if ( Aig_ObjIsNode(pObj) )
            Vec_VecPush( vGroups, nodePart, pObj );
    }

    // label PIs that should be restricted to some values
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                pDriver->fMarkA = 1; // const0 PI
            else
                pDriver->fMarkB = 1; // const1 PI
        }
    }

    // create partitions
    Vec_VecForEachLevel( vGroups, vNodes, i )
    {
        if ( Vec_PtrSize(vNodes) == 0 )
        {
            printf( "Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n", i );
            continue;
        }
        pAig = Aig_ManPartSplitOne( p, vNodes, &vPio2IdOne );
        Vec_PtrPush( vPio2Id, vPio2IdOne );
        Vec_PtrPush( vAigs, pAig );
    }
    Vec_VecFree( vGroups );

    // divide POs according to their partitions
    vPart2Pos = Vec_VecStart( Vec_PtrSize(vAigs) );
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
            pDriver->fMarkA = pDriver->fMarkB = 0;
        else
            Vec_VecPush( vPart2Pos, Vec_IntEntry(vNode2Part, Aig_ObjFaninId0(pObj)), pObj );
    }

    *pvPio2Id = vPio2Id;
    *pvPart2Pos = (Vec_Ptr_t *)vPart2Pos;
    return vAigs;
}